

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  string input;
  string key;
  string hmac_sha256;
  string time_token;
  string fingerprint;
  string hmac_sha512;
  string hex_output;
  string sha512_output;
  string sha256_output;
  string sha1_output;
  string hmac_sha512_upper;
  string totp_key;
  string timed_token;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"grape","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"12345","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SHA1","");
  print_section(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  hmac_hash::sha1(&local_b0,&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sha1(\'",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\') = ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n",0x34);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SHA256","");
  print_section(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  hmac_hash::sha256(&local_d0,&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sha256(\'",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\') = ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n",0x4c);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SHA512","");
  print_section(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  hmac_hash::sha512(&local_f0,&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sha512(\'",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\') = ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n"
             ,0x8c);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"to_hex","");
  print_section(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"012345","");
  hmac::to_hex(&local_110,&local_190,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"to_hex(\"012345\") = ",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"HMAC-SHA256","");
  print_section(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  hmac::get_hmac(&local_190,&local_1b0,&local_1d0,SHA256,true,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HMAC(\'",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', \'",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', SHA256) = ",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n",0x4c);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"HMAC-SHA512","");
  print_section(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  hmac::get_hmac(&local_130,&local_1b0,&local_1d0,SHA512,true,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HMAC(\'",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', \'",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', SHA512) = ",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n"
             ,0x8c);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"HMAC-SHA512 (uppercase)","");
  print_section(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  hmac::get_hmac(&local_90,&local_1b0,&local_1d0,SHA512,true,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HMAC(\'",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', \'",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"\', SHA512, hex=true, upper=true) = ",0x23);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"HMAC-TIMED TOKEN","");
  print_section(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  hmac::generate_time_token(&local_170,&local_1b0,0x3c,SHA256);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Time token (now) = ",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar3 = hmac::is_token_valid(&local_170,&local_1b0,0x3c,SHA256);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Token valid? = ",0xf);
  pcVar7 = "NO";
  pcVar8 = "NO";
  if (bVar3) {
    pcVar8 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,(ulong)bVar3 | 2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  paVar2 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"HMAC-TIMED TOKEN (with fingerprint)","");
  print_section(&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"my-client-unique-id","");
  hmac::generate_time_token(&local_50,&local_1b0,&local_150,0x3c,SHA256);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fingerprint = ",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Token = ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar3 = hmac::is_token_valid(&local_50,&local_1b0,&local_150,0x3c,SHA256);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Token valid (with fingerprint)? = ",0x22);
  if (bVar3) {
    pcVar7 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,(ulong)bVar3 | 2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"12345678901234567890","");
  iVar4 = hmac::get_totp_code_at(local_70,local_68,0x499602d2,0x1e,8,SHA1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TOTP: ",6);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Expected: 89005924\n\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nPress Enter to exit...",0x17);
  std::istream::get();
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
    const std::string input = "grape";
    const std::string key = "12345";
    
    // SHA1
    print_section("SHA1");
    std::string sha1_output = hmac_hash::sha1(input);
    std::cout << "sha1('" << input << "') = " << sha1_output << std::endl;
    std::cout << "Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n";

    // SHA256
    print_section("SHA256");
    std::string sha256_output = hmac_hash::sha256(input);
    std::cout << "sha256('" << input << "') = " << sha256_output << std::endl;
    std::cout << "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n";

    // SHA512
    print_section("SHA512");
    std::string sha512_output = hmac_hash::sha512(input);
    std::cout << "sha512('" << input << "') = " << sha512_output << std::endl;
    std::cout << "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n";

    // to_hex
    print_section("to_hex");
    std::string hex_output = hmac::to_hex("012345");
    std::cout << "to_hex(\"012345\") = " << hex_output << std::endl << std::endl;

    // HMAC-SHA256
    print_section("HMAC-SHA256");
    std::string hmac_sha256 = hmac::get_hmac(key, input, hmac::TypeHash::SHA256, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA256) = " << hmac_sha256 << std::endl;
    std::cout << "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n";

    // HMAC-SHA512
    print_section("HMAC-SHA512");
    std::string hmac_sha512 = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512) = " << hmac_sha512 << std::endl;
    std::cout << "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n";

    // HMAC-SHA512 uppercase hex
    print_section("HMAC-SHA512 (uppercase)");
    std::string hmac_sha512_upper = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512, hex=true, upper=true) = " << hmac_sha512_upper << std::endl;

    // HMAC TIME TOKEN
    print_section("HMAC-TIMED TOKEN");
    std::string time_token = hmac::generate_time_token(key, 60);
    std::cout << "Time token (now) = " << time_token << std::endl;
    bool valid = hmac::is_token_valid(time_token, key, 60);
    std::cout << "Token valid? = " << (valid ? "YES" : "NO") << std::endl;

    // HMAC TIME TOKEN + fingerprint
    print_section("HMAC-TIMED TOKEN (with fingerprint)");
    std::string fingerprint = "my-client-unique-id";
    std::string timed_token = hmac::generate_time_token(key, fingerprint, 60);
    std::cout << "Fingerprint = " << fingerprint << std::endl;
    std::cout << "Token = " << timed_token << std::endl;
    bool valid_fp = hmac::is_token_valid(timed_token, key, fingerprint, 60);
    std::cout << "Token valid (with fingerprint)? = " << (valid_fp ? "YES" : "NO") << std::endl;

    // TOTP
    std::string totp_key = "12345678901234567890"; // raw binary string (not base32!)
    uint64_t test_time = 1234567890;
    int code = hmac::get_totp_code_at(totp_key, test_time, 30, 8, hmac::TypeHash::SHA1);
    std::cout << "TOTP: " << code << std::endl;
    std::cout << "Expected: 89005924\n\n";
    
    // Pause before exit
    std::cout << "\nPress Enter to exit...";
    std::cin.get();
    return 0;
}